

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O3

void u_charsToUChars_63(char *cs,UChar *us,int32_t length)

{
  long lVar1;
  uint uVar2;
  
  if (0 < length) {
    uVar2 = length + 1;
    lVar1 = 0;
    do {
      us[lVar1] = (ushort)(byte)cs[lVar1];
      lVar1 = lVar1 + 1;
      uVar2 = uVar2 - 1;
    } while (1 < uVar2);
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_charsToUChars(const char *cs, UChar *us, int32_t length) {
    UChar u;
    uint8_t c;

    /*
     * Allow the entire ASCII repertoire to be mapped _to_ Unicode.
     * For EBCDIC systems, this works for characters with codes from
     * codepages 37 and 1047 or compatible.
     */
    while(length>0) {
        c=(uint8_t)(*cs++);
        u=(UChar)CHAR_TO_UCHAR(c);
        U_ASSERT((u!=0 || c==0)); /* only invariant chars converted? */
        *us++=u;
        --length;
    }
}